

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O0

float btSoftBodyHelpers::CalculateUV(int resx,int resy,int ix,int iy,int id)

{
  float tc;
  int id_local;
  int iy_local;
  int ix_local;
  int resy_local;
  int resx_local;
  
  tc = 0.0;
  if (id == 0) {
    tc = (1.0 / (float)(resx + -1)) * (float)ix;
  }
  else if (id == 1) {
    tc = (1.0 / (float)(resy + -1)) * (float)((resy + -1) - iy);
  }
  else if (id == 2) {
    tc = (1.0 / (float)(resy + -1)) * (float)((resy - iy) + -2);
  }
  else if (id == 3) {
    tc = (1.0 / (float)(resx + -1)) * (float)(ix + 1);
  }
  return tc;
}

Assistant:

float   btSoftBodyHelpers::CalculateUV(int resx,int resy,int ix,int iy,int id)
{

	/*
	*
	*
	*    node00 --- node01
	*      |          |
	*    node10 --- node11
	*
	*
	*   ID map:
	*
	*   node00 s --> 0
	*   node00 t --> 1
	*
	*   node01 s --> 3
	*   node01 t --> 1
	*
	*   node10 s --> 0
	*   node10 t --> 2
	*
	*   node11 s --> 3
	*   node11 t --> 2
	*
	*
	*/

	float tc=0.0f;
	if (id == 0) {
		tc = (1.0f/((resx-1))*ix);
	}
	else if (id==1) {
		tc = (1.0f/((resy-1))*(resy-1-iy));
	}
	else if (id==2) {
		tc = (1.0f/((resy-1))*(resy-1-iy-1));
	}
	else if (id==3) {
		tc = (1.0f/((resx-1))*(ix+1));
	}
	return tc;
}